

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialJPDPValuePair.cpp
# Opt level: O1

void __thiscall
PartialJPDPValuePair::PartialJPDPValuePair(PartialJPDPValuePair *this,PartialJPDPValuePair *o)

{
  element_type *peVar1;
  shared_count sVar2;
  int iVar3;
  PartialJointPolicyDiscretePure *__tmp;
  undefined4 extraout_var;
  undefined1 auVar4 [64];
  shared_ptr<PartialJointPolicyDiscretePure> local_58;
  element_type *local_48;
  shared_count asStack_40 [2];
  
  (this->super_PartialJointPolicyValuePair).super_PartialPolicyPoolItemInterface.
  _vptr_PartialPolicyPoolItemInterface = (_func_int **)&PTR__PartialPolicyPoolItemInterface_005ae5e8
  ;
  (this->super_PartialJointPolicyValuePair)._m_val = (o->super_PartialJointPolicyValuePair)._m_val;
  (this->super_PartialJointPolicyValuePair).super_PartialPolicyPoolItemInterface.
  _vptr_PartialPolicyPoolItemInterface = (_func_int **)&PTR__PartialJPDPValuePair_005ae520;
  auVar4 = ZEXT864(0) << 0x20;
  (this->_m_jpol).px = (element_type *)SUB168(auVar4._0_16_,0);
  (this->_m_jpol).pn = (shared_count)SUB168(auVar4._0_16_,8);
  (this->_m_bgip_solver).px = (element_type *)SUB168(auVar4._16_16_,0);
  (this->_m_bgip_solver).pn = (shared_count)SUB168(auVar4._16_16_,8);
  (this->_m_bgcg_solver).px = (element_type *)SUB168(auVar4._32_16_,0);
  (this->_m_bgcg_solver).pn = (shared_count)SUB168(auVar4._32_16_,8);
  (this->_m_bgip_solver_T).px = (element_type *)SUB168(auVar4._48_16_,0);
  (this->_m_bgip_solver_T).pn = (shared_count)SUB168(auVar4._48_16_,8);
  (this->_m_bgip_solver).px = (element_type *)SUB168(auVar4._0_16_,0);
  (this->_m_bgip_solver).pn = (shared_count)SUB168(auVar4._0_16_,8);
  (this->_m_bgcg_solver).px = (element_type *)SUB168(auVar4._16_16_,0);
  (this->_m_bgcg_solver).pn = (shared_count)SUB168(auVar4._16_16_,8);
  (this->_m_bgip_solver_T).px = (element_type *)SUB168(auVar4._32_16_,0);
  (this->_m_bgip_solver_T).pn = (shared_count)SUB168(auVar4._32_16_,8);
  (this->_m_bgip_solver_TC).px = (element_type *)SUB168(auVar4._48_16_,0);
  (this->_m_bgip_solver_TC).pn = (shared_count)SUB168(auVar4._48_16_,8);
  iVar3 = (*(((o->_m_jpol).px)->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.
            super_JointPolicy._vptr_JointPolicy[5])();
  boost::shared_ptr<PartialJointPolicyDiscretePure>::shared_ptr<PartialJointPolicyDiscretePure>
            (&local_58,(PartialJointPolicyDiscretePure *)CONCAT44(extraout_var,iVar3));
  sVar2.pi_ = local_58.pn.pi_;
  peVar1 = local_58.px;
  local_58.px = (element_type *)0x0;
  local_58.pn.pi_ = (sp_counted_base *)0x0;
  local_48 = (this->_m_jpol).px;
  asStack_40[0].pi_ = (this->_m_jpol).pn.pi_;
  (this->_m_jpol).px = peVar1;
  (this->_m_jpol).pn.pi_ = sVar2.pi_;
  boost::detail::shared_count::~shared_count(asStack_40);
  boost::detail::shared_count::~shared_count(&local_58.pn);
  boost::shared_ptr<BayesianGameIdenticalPayoffSolver>::operator=
            (&this->_m_bgip_solver,&o->_m_bgip_solver);
  boost::shared_ptr<BGCG_Solver>::operator=(&this->_m_bgcg_solver,&o->_m_bgcg_solver);
  boost::shared_ptr<BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>_>::operator=
            (&this->_m_bgip_solver_T,&o->_m_bgip_solver_T);
  boost::shared_ptr<BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVectorForClusteredBG>_>::
  operator=(&this->_m_bgip_solver_TC,&o->_m_bgip_solver_TC);
  return;
}

Assistant:

PartialJPDPValuePair::PartialJPDPValuePair(const PartialJPDPValuePair& o) :
    PartialJointPolicyValuePair(o)
{
    _m_jpol = PJPDP_sharedPtr(o._m_jpol->Clone());
    _m_bgip_solver = o._m_bgip_solver;
    _m_bgcg_solver = o._m_bgcg_solver;    
    _m_bgip_solver_T = o._m_bgip_solver_T;
    _m_bgip_solver_TC = o._m_bgip_solver_TC;    
}